

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O3

void __thiscall QL_NodeRel::QL_NodeRel(QL_NodeRel *this,QL_Manager *qlm,RelCatEntry *rEntry)

{
  char *__dest;
  size_t sVar1;
  
  QL_Node::QL_Node(&this->super_QL_Node,qlm);
  (this->super_QL_Node)._vptr_QL_Node = (_func_int **)&PTR_OpenIt_00127a18;
  RM_FileHandle::RM_FileHandle(&this->fh);
  IX_Manager::DestroyIndex((IX_Manager *)&this->ih);
  RM_FileScan::RM_FileScan(&this->fs);
  IX_IndexHandle::DeleteEntry((IX_IndexHandle *)&this->is);
  __dest = (char *)malloc(0x19);
  this->relName = __dest;
  __dest[0] = '\0';
  __dest[1] = '\0';
  __dest[2] = '\0';
  __dest[3] = '\0';
  __dest[4] = '\0';
  __dest[5] = '\0';
  __dest[6] = '\0';
  __dest[7] = '\0';
  sVar1 = strlen(rEntry->relName);
  memcpy(__dest,rEntry,sVar1 + 1);
  this->relNameInitialized = true;
  (this->super_QL_Node).listsInitialized = false;
  (this->super_QL_Node).isOpen = false;
  (this->super_QL_Node).tupleLength = rEntry->tupleLength;
  this->useIndex = false;
  this->indexNo = 0;
  this->indexAttr = 0;
  (this->super_QL_Node).useIndexJoin = false;
  return;
}

Assistant:

QL_NodeRel::QL_NodeRel(QL_Manager &qlm, RelCatEntry *rEntry) : QL_Node(qlm){
  relName = (char *)malloc(MAXNAME+1);
  memset((void *)relName, 0, sizeof(relName));
  memcpy(this->relName, rEntry->relName, strlen(rEntry->relName) + 1);
  relNameInitialized = true;
  listsInitialized = false;

  isOpen = false;
  tupleLength = rEntry->tupleLength;

  useIndex = false;
  indexNo = 0;
  indexAttr = 0;
  void *value = NULL;
  useIndexJoin = false;
}